

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O3

char * glfwGetKeyName(int key,int scancode)

{
  char *pcVar1;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    if (key == -1) {
LAB_0017dcae:
      pcVar1 = (*_glfw.platform.getScancodeName)(scancode);
      return pcVar1;
    }
    if (key - 0x15dU < 0xfffffec3) {
      _glfwInputError(0x10003,"Invalid key %i");
    }
    else if ((0xffffff83 < key - 0xa3U || 0xfffffff0 < key - 0x14fU) || key == 0x150) {
      scancode = (*_glfw.platform.getKeyScancode)(key);
      goto LAB_0017dcae;
    }
  }
  return (char *)0x0;
}

Assistant:

GLFWAPI const char* glfwGetKeyName(int key, int scancode)
{
    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (key != GLFW_KEY_UNKNOWN)
    {
        if (key < GLFW_KEY_SPACE || key > GLFW_KEY_LAST)
        {
            _glfwInputError(GLFW_INVALID_ENUM, "Invalid key %i", key);
            return NULL;
        }

        if (key != GLFW_KEY_KP_EQUAL &&
            (key < GLFW_KEY_KP_0 || key > GLFW_KEY_KP_ADD) &&
            (key < GLFW_KEY_APOSTROPHE || key > GLFW_KEY_WORLD_2))
        {
            return NULL;
        }

        scancode = _glfw.platform.getKeyScancode(key);
    }

    return _glfw.platform.getScancodeName(scancode);
}